

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

ktx_error_code_e ktxPrintInfoForStdioStream(FILE *stdioStream)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  
  if (stdioStream != (FILE *)0x0) {
    kVar1 = ktxFileStream_construct(&stream,stdioStream,false);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxPrintInfoForStream(&stream);
    }
    return kVar1;
  }
  return KTX_INVALID_VALUE;
}

Assistant:

KTX_error_code
ktxPrintInfoForStdioStream(FILE* stdioStream)
{
    KTX_error_code result;
    ktxStream stream;

    if (stdioStream == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS)
        result = ktxPrintInfoForStream(&stream);
    return result;
}